

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadControllerJoints(ColladaParser *this,Controller *pController)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ostream *poVar5;
  size_type *psVar6;
  char *__s;
  string *psVar7;
  char *attrSource;
  char *attrSemantic;
  char *local_1f0;
  char *local_1e8;
  size_type *local_1e0;
  string *local_1d8;
  string *local_1d0;
  string local_1c8;
  string local_1a8 [11];
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    local_1d8 = &pController->mJointOffsetMatrixSource;
    local_1e0 = &(pController->mJointOffsetMatrixSource)._M_string_length;
    local_1d0 = &pController->mJointNameSource;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"input");
        if (iVar2 == 0) {
          uVar4 = GetAttribute(this,"semantic");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          local_1e8 = (char *)CONCAT44(extraout_var_00,iVar2);
          uVar4 = GetAttribute(this,"source");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          pcVar1 = local_1e8;
          local_1f0 = (char *)CONCAT44(extraout_var_01,iVar2);
          if (*local_1f0 != '#') {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsupported URL format in \"",0x1b);
            poVar5 = (ostream *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_1a8,&local_1f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" in source attribute of <joints> data <input> element",0x36);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1c8);
          }
          __s = local_1f0 + 1;
          local_1f0 = __s;
          iVar2 = strcmp(local_1e8,"JOINT");
          psVar6 = &(pController->mJointNameSource)._M_string_length;
          psVar7 = local_1d0;
          if ((iVar2 != 0) &&
             (iVar2 = strcmp(pcVar1,"INV_BIND_MATRIX"), psVar6 = local_1e0, psVar7 = local_1d8,
             iVar2 != 0)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unknown semantic \"",0x12);
            poVar5 = (ostream *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *
                                )local_1a8,&local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\" in <joints> data <input> element",0x22);
            std::__cxx11::stringbuf::str();
            ThrowException(this,&local_1c8);
          }
          pcVar1 = (char *)*psVar6;
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)psVar7,0,pcVar1,(ulong)__s);
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar2 != '\0') goto LAB_0043558a;
        }
        SkipElement(this);
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"joints");
        if (iVar2 == 0) {
          return;
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"Expected end of <joints> element.","");
        ThrowException(this,local_1a8);
      }
LAB_0043558a:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadControllerJoints(Collada::Controller& pController)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // Input channels for joint data. Two possible semantics: "JOINT" and "INV_BIND_MATRIX"
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* attrSemantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* attrSource = mReader->getAttributeValue(indexSource);

                // local URLS always start with a '#'. We don't support global URLs
                if (attrSource[0] != '#')
                    ThrowException(format() << "Unsupported URL format in \"" << attrSource << "\" in source attribute of <joints> data <input> element");
                attrSource++;

                // parse source URL to corresponding source
                if (strcmp(attrSemantic, "JOINT") == 0)
                    pController.mJointNameSource = attrSource;
                else if (strcmp(attrSemantic, "INV_BIND_MATRIX") == 0)
                    pController.mJointOffsetMatrixSource = attrSource;
                else
                    ThrowException(format() << "Unknown semantic \"" << attrSemantic << "\" in <joints> data <input> element");

                // skip inner data, if present
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "joints") != 0)
                ThrowException("Expected end of <joints> element.");

            break;
        }
    }
}